

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder.c
# Opt level: O1

void HPDF_Encoder_SetParseText
               (HPDF_Encoder encoder,HPDF_ParseText_Rec *state,HPDF_BYTE *text,HPDF_UINT len)

{
  state->text = text;
  state->index = 0;
  state->len = len;
  state->byte_type = HPDF_BYTE_TYPE_SINGLE;
  return;
}

Assistant:

void
HPDF_Encoder_SetParseText  (HPDF_Encoder        encoder,
                            HPDF_ParseText_Rec  *state,
                            const HPDF_BYTE     *text,
                            HPDF_UINT           len)
{
    HPDF_PTRACE ((" HPDF_CMapEncoder_SetParseText\n"));
    HPDF_UNUSED (encoder);

    state->text = text;
    state->index = 0;
    state->len = len;
    state->byte_type = HPDF_BYTE_TYPE_SINGLE;
}